

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

void __thiscall
ncnn::Deconvolution::cut_padding
          (Deconvolution *this,Mat *top_blob_bordered,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int left;
  int iVar3;
  int right;
  int iVar4;
  
  left = this->pad_left;
  right = this->pad_right;
  if (((right < 1 && left < 1) && (iVar4 = this->pad_top, iVar4 < 1)) &&
     (iVar2 = this->pad_bottom, iVar2 < 1)) {
    if ((this->output_w < 1) || (this->output_h < 1)) {
      Mat::operator=(top_blob,top_blob_bordered);
      return;
    }
    iVar3 = top_blob_bordered->w - this->output_w;
    iVar1 = top_blob_bordered->h - this->output_h;
    if ((iVar4 == -0xe9 || (right == -0xe9 || left == -0xe9)) || iVar2 == -0xe9) {
      iVar4 = iVar1 / 2;
      iVar2 = iVar1 - iVar4;
      left = iVar3 / 2;
      right = iVar3 - left;
    }
    else {
      if ((iVar4 != -0xea && (right != -0xea && left != -0xea)) && iVar2 != -0xea) {
        return;
      }
      iVar2 = iVar1 / 2;
      iVar4 = iVar1 - iVar2;
      right = iVar3 / 2;
      left = iVar3 - right;
    }
  }
  else {
    iVar4 = this->pad_top;
    iVar2 = this->pad_bottom;
  }
  copy_cut_border(top_blob_bordered,top_blob,iVar4,iVar2,left,right,opt);
  return;
}

Assistant:

void Deconvolution::cut_padding(const Mat& top_blob_bordered, Mat& top_blob, const Option& opt) const
{
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        copy_cut_border(top_blob_bordered, top_blob, pad_top, pad_bottom, pad_left, pad_right, opt);
    }
    else if (output_w > 0 && output_h > 0)
    {
        int wcut = top_blob_bordered.w - output_w;
        int hcut = top_blob_bordered.h - output_h;

        if (pad_left == -233 || pad_right == -233 || pad_top == -233 || pad_bottom == -233)
        {
            // onnx padding=SAME_UPPER
            copy_cut_border(top_blob_bordered, top_blob, hcut / 2, hcut - hcut / 2, wcut / 2, wcut - wcut / 2, opt);
        }
        else if (pad_left == -234 || pad_right == -234 || pad_top == -234 || pad_bottom == -234)
        {
            // onnx padding=SAME_LOWER
            copy_cut_border(top_blob_bordered, top_blob, hcut - hcut / 2, hcut / 2, wcut - wcut / 2, wcut / 2, opt);
        }
    }
    else
    {
        top_blob = top_blob_bordered;
    }
}